

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

void __thiscall
DatabaseSnapshot::DatabaseSnapshot
          (DatabaseSnapshot *this,path *db_name,path *db_base,DatabaseConfig *config,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          *iterators,vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets
          ,unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
           *tasks)

{
  _Rb_tree_header *p_Var1;
  pointer ppOVar2;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_name,db_name);
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->iterators)._M_t._M_impl.super__Rb_tree_header,
             &(iterators->_M_t)._M_impl.super__Rb_tree_header);
  (this->config).config_.m_type = (config->config_).m_type;
  (this->config).config_.m_value = (config->config_).m_value;
  (config->config_).m_type = null;
  (config->config_).m_value.object = (object_t *)0x0;
  ppOVar2 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  (this->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  (this->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppOVar2;
  (this->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (datasets->super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->locked_datasets)._M_t._M_impl.super__Rb_tree_header;
  (this->locked_datasets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->locked_datasets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->locked_datasets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->locked_datasets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->locked_datasets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->locked_iterators)._M_t._M_impl.super__Rb_tree_header;
  (this->locked_iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->locked_iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->locked_iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->locked_iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->locked_iterators)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->tasks)._M_h,tasks,tasks);
  return;
}

Assistant:

DatabaseSnapshot::DatabaseSnapshot(
    fs::path db_name, fs::path db_base, DatabaseConfig config,
    std::map<std::string, OnDiskIterator> iterators,
    std::vector<const OnDiskDataset *> datasets,
    std::unordered_map<uint64_t, TaskSpec> tasks)
    : db_name(std::move(db_name)),
      db_base(std::move(db_base)),
      iterators(std::move(iterators)),
      config(std::move(config)),
      datasets(std::move(datasets)),
      tasks(std::move(tasks)) {}